

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

bool __thiscall QTextStreamPrivate::getReal(QTextStreamPrivate *this,double *f)

{
  QLocale *this_00;
  char16_t cVar1;
  long lVar2;
  QChar ch;
  bool bVar3;
  char cVar4;
  char32_t cVar5;
  int iVar6;
  QString *this_01;
  double dVar7;
  uint *puVar8;
  uchar (*pauVar9) [10];
  uchar (*pauVar10) [10];
  undefined1 uVar11;
  ulong uVar12;
  QArrayDataPointer<char16_t> *pQVar13;
  long lVar14;
  long in_FS_OFFSET;
  QByteArrayView ba;
  ulong uStack_140;
  char16_t local_134;
  QArrayDataPointer<char16_t> local_120;
  QArrayDataPointer<char16_t> local_108;
  bool ok;
  QArrayDataPointer<char16_t> local_d8;
  QChar local_ba;
  char buf [128];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pauVar10 = (uchar (*) [10])0x0;
  scan(this,(QChar **)0x0,(qsizetype *)0x0,0,NotSpace);
  consumeLastToken(this);
  buf._112_8_ = &DAT_aaaaaaaaaaaaaaaa;
  buf._120_8_ = &DAT_aaaaaaaaaaaaaaaa;
  buf._96_8_ = &DAT_aaaaaaaaaaaaaaaa;
  buf._104_8_ = &DAT_aaaaaaaaaaaaaaaa;
  buf._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
  buf._88_8_ = &DAT_aaaaaaaaaaaaaaaa;
  buf._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  buf._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  buf._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  buf._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
  buf._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  buf._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_ba.ucs = L'\0';
  buf._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  buf._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  buf._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  buf._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = &this->locale;
  lVar14 = 0;
  uVar12 = 0;
  while (bVar3 = getChar(this,&local_ba), puVar8 = (uint *)pauVar10, bVar3) {
    cVar5 = (char32_t)(ushort)local_ba.ucs;
    puVar8 = &switchD_002cd151::switchdataD_004733e0;
    uStack_140 = 2;
    switch(local_ba.ucs) {
    case L'0':
    case L'1':
    case L'2':
    case L'3':
    case L'4':
    case L'5':
    case L'6':
    case L'7':
    case L'8':
    case L'9':
      break;
    case L':':
    case L';':
    case L'<':
    case L'=':
    case L'>':
    case L'?':
    case L'@':
    case L'B':
    case L'C':
    case L'D':
    case L'E':
    case L'G':
    case L'H':
    case L'J':
    case L'K':
    case L'L':
    case L'M':
    case L'O':
    case L'P':
    case L'Q':
    case L'R':
    case L'S':
      goto switchD_002cd151_caseD_3a;
    case L'A':
switchD_002cd151_caseD_41:
      uStack_140 = 8;
      break;
    case L'F':
switchD_002cd151_caseD_46:
      uStack_140 = 7;
      break;
    case L'I':
switchD_002cd151_caseD_49:
      uStack_140 = 5;
      break;
    case L'N':
switchD_002cd151_caseD_4e:
      uStack_140 = 6;
      break;
    case L'T':
switchD_002cd151_caseD_54:
      uStack_140 = 9;
      break;
    default:
      puVar8 = (uint *)pauVar10;
      if (local_ba.ucs == L'a') goto switchD_002cd151_caseD_41;
      if (local_ba.ucs == L'f') goto switchD_002cd151_caseD_46;
      if (cVar5 == L't') goto switchD_002cd151_caseD_54;
      if (cVar5 == L'n') goto switchD_002cd151_caseD_4e;
      if (cVar5 == L'i') goto switchD_002cd151_caseD_49;
switchD_002cd151_caseD_3a:
      cVar5 = QChar::toLower(cVar5);
      QLocale::decimalPoint((QString *)&ok,this_00);
      QString::toLower_helper((QString *)&local_d8,(QString *)&ok);
      local_134 = (char16_t)cVar5;
      if (local_d8.size == 1) {
        cVar1 = *local_d8.ptr;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&ok);
        uStack_140 = 3;
        if (cVar1 == local_134) break;
      }
      else {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&ok);
      }
      QLocale::exponential((QString *)&ok,this_00);
      QString::toLower_helper((QString *)&local_d8,(QString *)&ok);
      if (local_d8.size == 1) {
        cVar1 = *local_d8.ptr;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&ok);
        uStack_140 = 4;
        if (cVar1 == local_134) break;
      }
      else {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&ok);
      }
      QLocale::negativeSign((QString *)&ok,this_00);
      QString::toLower_helper((QString *)&local_d8,(QString *)&ok);
      if ((local_d8.size == 1) && (puVar8 = (uint *)(ulong)(uint)cVar5, *local_d8.ptr == local_134))
      {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&ok);
        uStack_140 = 1;
      }
      else {
        QLocale::positiveSign((QString *)&local_120,this_00);
        pQVar13 = &local_120;
        QString::toLower_helper((QString *)&local_108,(QString *)&local_120);
        if (local_108.size == 1) {
          cVar1 = *local_108.ptr;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&ok);
          uStack_140 = 1;
          if (cVar1 == local_134) break;
        }
        else {
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&ok);
        }
        QLocale::c(&local_108,pQVar13);
        bVar3 = ::operator!=(this_00,(QLocale *)&local_108);
        if (bVar3) {
          QLocale::groupSeparator((QString *)&ok,this_00);
          QString::toLower_helper((QString *)&local_d8,(QString *)&ok);
          if (local_d8.size == 1) {
            puVar8 = (uint *)(ulong)(uint)cVar5;
            uStack_140 = (ulong)((uint)(*local_d8.ptr == local_134) * 2);
          }
          else {
            uStack_140 = 0;
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&ok);
        }
        else {
          uStack_140 = 0;
        }
        QLocale::~QLocale((QLocale *)&local_108);
      }
    }
    if (lVar14 == 0x7c) {
      ungetChar(this,local_ba);
      lVar14 = 0x7c;
      goto LAB_002cd444;
    }
    pauVar9 = getReal::table;
    pauVar10 = getReal::table + uVar12;
    uVar12 = (ulong)(*pauVar10)[uStack_140];
    if ((uVar12 == 0xd) || ((*pauVar10)[uStack_140] == 0)) {
      ungetChar(this,local_ba);
      puVar8 = (uint *)pauVar9;
      break;
    }
    pauVar10 = (uchar (*) [10])0x0;
    cVar4 = (char)local_ba.ucs;
    if (0xff < (ushort)local_ba.ucs) {
      cVar4 = '\0';
    }
    buf[lVar14] = cVar4;
    lVar14 = lVar14 + 1;
  }
  if (lVar14 == 0) {
    uVar11 = 0;
    goto LAB_002cd592;
  }
  goto LAB_002cd46e;
  while (bVar3 = QChar::isDigit((uint)(ushort)local_ba.ucs), bVar3) {
LAB_002cd444:
    bVar3 = getChar(this,&local_ba);
    ch.ucs = local_ba.ucs;
    if (!bVar3) goto LAB_002cd46e;
  }
  ungetChar(this,ch);
LAB_002cd46e:
  uVar11 = 1;
  if (f != (double *)0x0) {
    buf[lVar14] = '\0';
    iVar6 = qstricmp(buf,"nan");
    if (((iVar6 == 0) || (iVar6 = qstricmp(buf,"+nan"), iVar6 == 0)) ||
       (iVar6 = qstricmp(buf,"-nan"), iVar6 == 0)) {
      dVar7 = NAN;
    }
    else {
      iVar6 = qstricmp(buf,"+inf");
      if ((iVar6 == 0) || (iVar6 = qstricmp(buf,"inf"), iVar6 == 0)) {
        dVar7 = INFINITY;
      }
      else {
        iVar6 = qstricmp(buf,"-inf");
        if (iVar6 != 0) {
          ok = true;
          this_01 = (QString *)QByteArrayView::lengthHelperCharArray(buf,0x80);
          ba.m_data = (storage_type *)puVar8;
          ba.m_size = (qsizetype)buf;
          QString::fromLatin1((QString *)&local_d8,this_01,ba);
          dVar7 = QLocale::toDouble(this_00,(QString *)&local_d8,&ok);
          *f = dVar7;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
          uVar11 = ok;
          goto LAB_002cd592;
        }
        dVar7 = -INFINITY;
      }
    }
    *f = dVar7;
  }
LAB_002cd592:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return (bool)uVar11;
}

Assistant:

bool QTextStreamPrivate::getReal(double *f)
{
    // We use a table-driven FSM to parse floating point numbers
    // strtod() cannot be used directly since we may be reading from a
    // QIODevice.
    enum ParserState {
        Init = 0,
        Sign = 1,
        Mantissa = 2,
        Dot = 3,
        Abscissa = 4,
        ExpMark = 5,
        ExpSign = 6,
        Exponent = 7,
        Nan1 = 8,
        Nan2 = 9,
        Inf1 = 10,
        Inf2 = 11,
        NanInf = 12,
        Done = 13
    };
    enum InputToken {
        None = 0,
        InputSign = 1,
        InputDigit = 2,
        InputDot = 3,
        InputExp = 4,
        InputI = 5,
        InputN = 6,
        InputF = 7,
        InputA = 8,
        InputT = 9
    };

    static const uchar table[13][10] = {
        // None InputSign InputDigit InputDot InputExp InputI    InputN    InputF    InputA    InputT
        { 0,    Sign,     Mantissa,  Dot,     0,       Inf1,     Nan1,     0,        0,        0      }, // 0  Init
        { 0,    0,        Mantissa,  Dot,     0,       Inf1,     Nan1,     0,        0,        0      }, // 1  Sign
        { Done, Done,     Mantissa,  Dot,     ExpMark, 0,        0,        0,        0,        0      }, // 2  Mantissa
        { 0,    0,        Abscissa,  0,       0,       0,        0,        0,        0,        0      }, // 3  Dot
        { Done, Done,     Abscissa,  Done,    ExpMark, 0,        0,        0,        0,        0      }, // 4  Abscissa
        { 0,    ExpSign,  Exponent,  0,       0,       0,        0,        0,        0,        0      }, // 5  ExpMark
        { 0,    0,        Exponent,  0,       0,       0,        0,        0,        0,        0      }, // 6  ExpSign
        { Done, Done,     Exponent,  Done,    Done,    0,        0,        0,        0,        0      }, // 7  Exponent
        { 0,    0,        0,         0,       0,       0,        0,        0,        Nan2,     0      }, // 8  Nan1
        { 0,    0,        0,         0,       0,       0,        NanInf,   0,        0,        0      }, // 9  Nan2
        { 0,    0,        0,         0,       0,       0,        Inf2,     0,        0,        0      }, // 10 Inf1
        { 0,    0,        0,         0,       0,       0,        0,        NanInf,   0,        0      }, // 11 Inf2
        { Done, 0,        0,         0,       0,       0,        0,        0,        0,        0      }, // 11 NanInf
    };

    ParserState state = Init;
    InputToken input = None;

    scan(nullptr, nullptr, 0, NotSpace);
    consumeLastToken();

    const qsizetype BufferSize = 128;
    char buf[BufferSize];
    qsizetype i = 0;

    QChar c;
    while (getChar(&c)) {
        switch (c.unicode()) {
        case u'0': case u'1': case u'2': case u'3': case u'4':
        case u'5': case u'6': case u'7': case u'8': case u'9':
            input = InputDigit;
            break;
        case u'i': case u'I':
            input = InputI;
            break;
        case u'n': case u'N':
            input = InputN;
            break;
        case u'f': case u'F':
            input = InputF;
            break;
        case u'a': case u'A':
            input = InputA;
            break;
        case u't': case u'T':
            input = InputT;
            break;
        default: {
            QChar lc = c.toLower();
            if (lc == locale.decimalPoint().toLower())
                input = InputDot;
            else if (lc == locale.exponential().toLower())
                input = InputExp;
            else if (lc == locale.negativeSign().toLower()
                     || lc == locale.positiveSign().toLower())
                input = InputSign;
            else if (locale != QLocale::c() // backward-compatibility
                     && lc == locale.groupSeparator().toLower())
                input = InputDigit; // well, it isn't a digit, but no one cares.
            else
                input = None;
        }
            break;
        }

        state = ParserState(table[state][input]);

        if  (state == Init || state == Done || i > (BufferSize - 5)) {
            ungetChar(c);
            if (i > (BufferSize - 5)) { // ignore rest of digits
                while (getChar(&c)) {
                    if (!c.isDigit()) {
                        ungetChar(c);
                        break;
                    }
                }
            }
            break;
        }

        buf[i++] = c.toLatin1();
    }

    if (i == 0)
        return false;
    if (!f)
        return true;
    buf[i] = '\0';

    // backward-compatibility. Old implementation supported +nan/-nan
    // for some reason. QLocale only checks for lower-case
    // nan/+inf/-inf, so here we also check for uppercase and mixed
    // case versions.
    if (!qstricmp(buf, "nan") || !qstricmp(buf, "+nan") || !qstricmp(buf, "-nan")) {
        *f = qt_qnan();
        return true;
    } else if (!qstricmp(buf, "+inf") || !qstricmp(buf, "inf")) {
        *f = qt_inf();
        return true;
    } else if (!qstricmp(buf, "-inf")) {
        *f = -qt_inf();
        return true;
    }
    bool ok;
    *f = locale.toDouble(QString::fromLatin1(buf), &ok);
    return ok;
}